

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

MessageLite * google::protobuf::internal::DuplicateIfNonNullInternal(MessageLite *message)

{
  MessageLite *this;
  
  if (message == (MessageLite *)0x0) {
    this = (MessageLite *)0x0;
  }
  else {
    this = MessageLite::New(message);
    MessageLite::CheckTypeAndMergeFrom(this,message);
  }
  return this;
}

Assistant:

MessageLite* DuplicateIfNonNullInternal(MessageLite* message) {
  if (message) {
    MessageLite* ret = message->New();
    ret->CheckTypeAndMergeFrom(*message);
    return ret;
  } else {
    return nullptr;
  }
}